

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

iterator __thiscall
cmComputeLinkDepends::AllocateLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item)

{
  size_type sVar1;
  _Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_> _Var2;
  __enable_if_t<is_constructible<value_type,_pair<const_cmLinkItem,_int>_&>::value,_pair<iterator,_bool>_>
  _Var3;
  value_type local_a0;
  _Base_ptr local_98;
  undefined1 local_90;
  _Base_ptr local_78;
  undefined1 local_70;
  int local_64;
  undefined1 local_60 [8];
  value_type index_entry;
  cmLinkItem *item_local;
  cmComputeLinkDepends *this_local;
  iterator lei;
  
  index_entry._56_8_ = item;
  sVar1 = std::
          vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
          ::size(&this->EntryList);
  local_64 = (int)sVar1;
  std::pair<const_cmLinkItem,_int>::pair<int,_true>
            ((pair<const_cmLinkItem,_int> *)local_60,item,&local_64);
  _Var3 = std::
          map<cmLinkItem,int,std::less<cmLinkItem>,std::allocator<std::pair<cmLinkItem_const,int>>>
          ::insert<std::pair<cmLinkItem_const,int>&>
                    ((map<cmLinkItem,int,std::less<cmLinkItem>,std::allocator<std::pair<cmLinkItem_const,int>>>
                      *)&this->LinkEntryIndex,(pair<const_cmLinkItem,_int> *)local_60);
  _Var2 = _Var3.first._M_node;
  local_90 = _Var3.second;
  local_98 = _Var2._M_node;
  local_78 = _Var2._M_node;
  local_70 = local_90;
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  emplace_back<>(&this->EntryList);
  local_a0 = (value_type)0x0;
  std::
  vector<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
  ::push_back(&this->InferredDependSets,&local_a0);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::emplace_back<>
            (&(this->EntryConstraintGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  std::pair<const_cmLinkItem,_int>::~pair((pair<const_cmLinkItem,_int> *)local_60);
  return (iterator)_Var2._M_node;
}

Assistant:

std::map<cmLinkItem, int>::iterator cmComputeLinkDepends::AllocateLinkEntry(
  cmLinkItem const& item)
{
  std::map<cmLinkItem, int>::value_type index_entry(
    item, static_cast<int>(this->EntryList.size()));
  std::map<cmLinkItem, int>::iterator lei =
    this->LinkEntryIndex.insert(index_entry).first;
  this->EntryList.emplace_back();
  this->InferredDependSets.push_back(nullptr);
  this->EntryConstraintGraph.emplace_back();
  return lei;
}